

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void fill_MPP_FMT_RGB888(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  RK_U8 RVar1;
  RK_U8 RVar2;
  
  RVar2 = (RK_U8)R;
  RVar1 = (RK_U8)B;
  if (be == 0) {
    RVar2 = (RK_U8)B;
    RVar1 = (RK_U8)R;
  }
  *p = RVar2;
  p[1] = (RK_U8)G;
  p[2] = RVar1;
  return;
}

Assistant:

static void fill_MPP_FMT_RGB888(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB888
    // 24 bit pixel     MSB  -------->  LSB
    //                 (rrrr,rrrr,gggg,gggg,bbbb,bbbb)
    // big    endian   |  byte 0 |  byte 1 |  byte 2 |
    // little endian   |  byte 2 |  byte 1 |  byte 0 |
    if (be) {
        p[0] = R;
        p[1] = G;
        p[2] = B;
    } else {
        p[0] = B;
        p[1] = G;
        p[2] = R;
    }
}